

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

internals * pybind11::detail::get_internals(void)

{
  bool bVar1;
  int iVar2;
  internals ***pppiVar3;
  PyObject *pPVar4;
  internals **ppiVar5;
  internals *this;
  unsigned_long uVar6;
  PyTypeObject *pPVar7;
  bool local_102;
  _func_void_exception_ptr *local_f8;
  PyObject *local_f0;
  item_accessor local_e8;
  capsule local_c8;
  long local_c0;
  PyThreadState *tstate;
  internals **internals_ptr;
  item_accessor local_a8;
  capsule local_88;
  byte local_7a;
  byte local_79;
  PyObject *local_78;
  item_accessor local_70;
  handle local_50;
  PyObject *local_48;
  handle local_40;
  handle builtins;
  handle local_28;
  str id;
  gil_scoped_acquire_local gil;
  internals ***internals_pp;
  
  pppiVar3 = get_internals_pp();
  if ((*pppiVar3 == (internals **)0x0) || (**pppiVar3 == (internals *)0x0)) {
    get_internals::gil_scoped_acquire_local::gil_scoped_acquire_local
              ((gil_scoped_acquire_local *)((long)&id.super_object.super_handle.m_ptr + 4));
    str::str((str *)&local_28,"__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
    pPVar4 = (PyObject *)PyEval_GetBuiltins();
    handle::handle(&local_40,pPVar4);
    local_79 = 0;
    local_7a = 0;
    bVar1 = object_api<pybind11::handle>::contains<pybind11::str&>
                      ((object_api<pybind11::handle> *)&local_40,(str *)&local_28);
    local_102 = false;
    if (bVar1) {
      local_78 = local_28.m_ptr;
      object_api<pybind11::handle>::operator[]
                (&local_70,(object_api<pybind11::handle> *)&local_40,local_28);
      local_79 = 1;
      accessor::operator_cast_to_object((accessor *)&local_50);
      local_7a = 1;
      local_48 = local_50.m_ptr;
      local_102 = isinstance<pybind11::capsule,_0>(local_50);
    }
    if ((local_7a & 1) != 0) {
      object::~object((object *)&local_50);
    }
    if ((local_79 & 1) != 0) {
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_70);
    }
    if (local_102 == false) {
      if (*pppiVar3 == (internals **)0x0) {
        ppiVar5 = (internals **)operator_new(8);
        *ppiVar5 = (internals *)0x0;
        *pppiVar3 = ppiVar5;
      }
      tstate = (PyThreadState *)*pppiVar3;
      this = (internals *)operator_new(0x1d8);
      memset(this,0,0x1d8);
      internals::internals(this);
      tstate->prev = (_ts *)this;
      local_c0 = PyThreadState_Get();
      uVar6 = PyThread_tss_alloc();
      tstate->prev[1].thread_id = uVar6;
      if ((uVar6 == 0) || (iVar2 = PyThread_tss_create(tstate->prev[1].thread_id), iVar2 != 0)) {
        pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
      }
      PyThread_tss_set(tstate->prev[1].thread_id,local_c0);
      *(undefined8 *)&tstate->prev[1].trash_delete_nesting = *(undefined8 *)(local_c0 + 0x10);
      capsule::capsule(&local_c8,*pppiVar3,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
      local_f0 = local_28.m_ptr;
      object_api<pybind11::handle>::operator[]
                (&local_e8,(object_api<pybind11::handle> *)&local_40,local_28);
      accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_e8,&local_c8);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_e8);
      capsule::~capsule(&local_c8);
      local_f8 = translate_exception;
      std::
      forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
      ::push_front((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                    *)&tstate->prev[1].c_profilefunc,&local_f8);
      pPVar7 = make_static_property_type();
      tstate->prev[1].dict = (PyObject *)pPVar7;
      pPVar7 = make_default_metaclass();
      *(PyTypeObject **)&tstate->prev[1].gilstate_counter = pPVar7;
      pPVar4 = make_object_base_type(*(PyTypeObject **)&tstate->prev[1].gilstate_counter);
      tstate->prev[1].async_exc = pPVar4;
    }
    else {
      internals_ptr = (internals **)local_28.m_ptr;
      object_api<pybind11::handle>::operator[]
                (&local_a8,(object_api<pybind11::handle> *)&local_40,local_28);
      capsule::capsule<pybind11::detail::accessor_policies::generic_item>(&local_88,&local_a8);
      ppiVar5 = capsule::operator_cast_to_internals__(&local_88);
      *pppiVar3 = ppiVar5;
      capsule::~capsule(&local_88);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_a8);
    }
    internals_pp = (internals ***)**pppiVar3;
    str::~str((str *)&local_28);
    get_internals::gil_scoped_acquire_local::~gil_scoped_acquire_local
              ((gil_scoped_acquire_local *)((long)&id.super_object.super_handle.m_ptr + 4));
  }
  else {
    internals_pp = (internals ***)**pppiVar3;
  }
  return (internals *)internals_pp;
}

Assistant:

PYBIND11_NOINLINE internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp) {
        return **internals_pp;
    }

    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state(PyGILState_Ensure()) {}
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;

    PYBIND11_STR_TYPE id(PYBIND11_INTERNALS_ID);
    auto builtins = handle(PyEval_GetBuiltins());
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_pp = static_cast<internals **>(capsule(builtins[id]));

        // We loaded builtins through python's builtins, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
        // libc++ with CPython doesn't require this (types are explicitly exported)
        // libc++ with PyPy still need it, awaiting further investigation
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(&translate_local_exception);
#endif
    } else {
        if (!internals_pp) {
            internals_pp = new internals *();
        }
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();
#if defined(WITH_THREAD)

#    if PY_VERSION_HEX < 0x03090000
        PyEval_InitThreads();
#    endif
        PyThreadState *tstate = PyThreadState_Get();
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->tstate)) {
            pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
        }
        PYBIND11_TLS_REPLACE_VALUE(internals_ptr->tstate, tstate);

#    if PYBIND11_INTERNALS_VERSION > 4
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->loader_life_support_tls_key)) {
            pybind11_fail("get_internals: could not successfully initialize the "
                          "loader_life_support TSS key!");
        }
#    endif
        internals_ptr->istate = tstate->interp;
#endif
        builtins[id] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(&translate_exception);
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
    }
    return **internals_pp;
}